

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O0

FUNCTION_RETURN getDiskInfos(DiskInfo *diskInfos,size_t *disk_info_size)

{
  int iVar1;
  void *__s;
  long lVar2;
  long *plVar3;
  DIR *pDVar4;
  int *piVar5;
  dirent *pdVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  FUNCTION_RETURN local_1194;
  FUNCTION_RETURN result;
  dirent *dir;
  DIR *disk_by_label;
  DIR *disk_by_uuid_dir;
  FILE *aFile;
  DiskInfo *tmpDrives;
  __ino64_t *statDrives;
  int drive_found;
  int i;
  int currentDrive;
  int maxDrives;
  mntent *ent;
  char cur_dir [4096];
  undefined1 local_140 [8];
  stat sym_stat;
  stat mount_stat;
  size_t *disk_info_size_local;
  DiskInfo *diskInfos_local;
  
  if (diskInfos == (DiskInfo *)0x0) {
    i = 0x14;
    aFile = (FILE *)malloc(0x28f0);
  }
  else {
    i = (int)*disk_info_size;
    aFile = (FILE *)diskInfos;
  }
  memset(aFile,0,(long)i * 0x20c);
  __s = malloc((long)i << 3);
  memset(__s,0,(long)i << 3);
  lVar2 = setmntent("/proc/mounts","r");
  if (lVar2 == 0) {
    free(aFile);
    free(__s);
    diskInfos_local._4_4_ = FUNC_RET_ERROR;
  }
  else {
    drive_found = 0;
    while (plVar3 = (long *)getmntent(lVar2), plVar3 != (long *)0x0) {
      iVar1 = strncmp((char *)plVar3[2],"ext",3);
      if (((((iVar1 == 0) || (iVar1 = strncmp((char *)plVar3[2],"xfs",3), iVar1 == 0)) ||
           (iVar1 = strncmp((char *)plVar3[2],"vfat",4), iVar1 == 0)) ||
          (iVar1 = strncmp((char *)plVar3[2],"ntfs",4), iVar1 == 0)) &&
         (((*plVar3 != 0 && (iVar1 = strncmp((char *)*plVar3,"/dev/",5), iVar1 == 0)) &&
          (iVar1 = stat((char *)*plVar3,(stat *)(sym_stat.__glibc_reserved + 2)), iVar1 == 0)))) {
        statDrives._0_4_ = -1;
        for (statDrives._4_4_ = 0; (int)statDrives._4_4_ < drive_found;
            statDrives._4_4_ = statDrives._4_4_ + 1) {
          if (*(__dev_t *)((long)__s + (long)(int)statDrives._4_4_ * 8) == mount_stat.st_dev) {
            statDrives._0_4_ = statDrives._4_4_;
          }
        }
        if ((int)statDrives == -1) {
          strncpy((char *)((long)aFile + (long)drive_found * 0x20c + 4),(char *)*plVar3,0xfe);
          *(__dev_t *)((long)__s + (long)drive_found * 8) = mount_stat.st_dev;
          statDrives._0_4_ = drive_found;
          drive_found = drive_found + 1;
        }
        iVar1 = strcmp((char *)plVar3[1],"/");
        if (iVar1 == 0) {
          strcpy((char *)((long)aFile + (long)(int)statDrives * 0x20c + 0x10b),"root");
          *(undefined1 *)((long)aFile + (long)(int)statDrives * 0x20c + 0x20a) = 1;
        }
      }
    }
    endmntent(lVar2);
    if (diskInfos == (DiskInfo *)0x0) {
      *disk_info_size = (long)drive_found;
      free(aFile);
      local_1194 = FUNC_RET_OK;
    }
    else if (*disk_info_size < (ulong)(long)drive_found) {
      local_1194 = FUNC_RET_BUFFER_TOO_SMALL;
    }
    else {
      pDVar4 = opendir("/dev/disk/by-uuid");
      if (pDVar4 == (DIR *)0x0) {
        piVar5 = __errno_location();
        __x = extraout_XMM0_Qa;
        if (*piVar5 != 0) {
          piVar5 = __errno_location();
          strerror(*piVar5);
          __x = extraout_XMM0_Qa_00;
        }
        _log(__x);
        free(__s);
        return FUNC_RET_ERROR;
      }
      local_1194 = FUNC_RET_OK;
      *disk_info_size = (long)drive_found;
      while (pdVar6 = readdir(pDVar4), pdVar6 != (dirent *)0x0) {
        strcpy((char *)&ent,"/dev/disk/by-uuid/");
        strncat((char *)&ent,pdVar6->d_name,200);
        iVar1 = stat((char *)&ent,(stat *)local_140);
        if (iVar1 == 0) {
          for (statDrives._4_4_ = 0; (int)statDrives._4_4_ < drive_found;
              statDrives._4_4_ = statDrives._4_4_ + 1) {
            if (sym_stat.st_dev == *(__dev_t *)((long)__s + (long)(int)statDrives._4_4_ * 8)) {
              parseUUID(pdVar6->d_name,
                        (uchar *)((long)aFile + (long)(int)statDrives._4_4_ * 0x20c + 0x103),8);
            }
          }
        }
      }
      closedir(pDVar4);
      pDVar4 = opendir("/dev/disk/by-label");
      if (pDVar4 != (DIR *)0x0) {
        while (pdVar6 = readdir(pDVar4), pdVar6 != (dirent *)0x0) {
          strcpy((char *)&ent,"/dev/disk/by-label/");
          strcat((char *)&ent,pdVar6->d_name);
          iVar1 = stat((char *)&ent,(stat *)local_140);
          if (iVar1 == 0) {
            for (statDrives._4_4_ = 0; (int)statDrives._4_4_ < drive_found;
                statDrives._4_4_ = statDrives._4_4_ + 1) {
              if (sym_stat.st_dev == *(__dev_t *)((long)__s + (long)(int)statDrives._4_4_ * 8)) {
                strncpy((char *)((long)aFile + (long)(int)statDrives._4_4_ * 0x20c + 0x10b),
                        pdVar6->d_name,0xfe);
                printf("label %d %s %s\n",(ulong)statDrives._4_4_,
                       (long)aFile + (long)(int)statDrives._4_4_ * 0x20c + 0x10b,
                       (long)aFile + (long)(int)statDrives._4_4_ * 0x20c + 4);
              }
            }
          }
        }
        closedir(pDVar4);
      }
    }
    free(__s);
    diskInfos_local._4_4_ = local_1194;
  }
  return diskInfos_local._4_4_;
}

Assistant:

FUNCTION_RETURN getDiskInfos(DiskInfo * diskInfos, size_t * disk_info_size) {
	struct stat mount_stat, sym_stat;
	/*static char discard[1024];
	 char device[64], name[64], type[64];
	 */
	char cur_dir[MAX_PATH];
	struct mntent *ent;

	int maxDrives, currentDrive, i, drive_found;
	__ino64_t *statDrives = NULL;
	DiskInfo *tmpDrives = NULL;
	FILE *aFile = NULL;
	DIR *disk_by_uuid_dir = NULL, *disk_by_label = NULL;
	struct dirent *dir = NULL;
	FUNCTION_RETURN result;

	if (diskInfos != NULL) {
		maxDrives = *disk_info_size;
		tmpDrives = diskInfos;
	} else {
		maxDrives = MAX_UNITS;
		tmpDrives = (DiskInfo *) malloc(sizeof(DiskInfo) * maxDrives);
	}
	memset(tmpDrives, 0, sizeof(DiskInfo) * maxDrives);
	statDrives = (__ino64_t *) malloc(maxDrives * sizeof(__ino64_t ));
	memset(statDrives, 0, sizeof(__ino64_t ) * maxDrives);
	;

	aFile = setmntent("/proc/mounts", "r");
	if (aFile == NULL) {
		/*proc not mounted*/
		free(tmpDrives);
		free(statDrives);
		return FUNC_RET_ERROR;
	}

	currentDrive = 0;
	while (NULL != (ent = getmntent(aFile))) {
		if ((strncmp(ent->mnt_type, "ext", 3) == 0
				|| strncmp(ent->mnt_type, "xfs", 3) == 0
				|| strncmp(ent->mnt_type, "vfat", 4) == 0
				|| strncmp(ent->mnt_type, "ntfs", 4) == 0)
				&& ent->mnt_fsname != NULL
				&& strncmp(ent->mnt_fsname, "/dev/", 5) == 0) {
			if (stat(ent->mnt_fsname, &mount_stat) == 0) {
				drive_found = -1;
				for (i = 0; i < currentDrive; i++) {
					if (statDrives[i] == mount_stat.st_ino) {
						drive_found = i;
					}
				}
				if (drive_found == -1) {
					LOG_DEBUG("mntent: %s %s %d\n", ent->mnt_fsname, ent->mnt_dir,
							(unsigned long int)mount_stat.st_ino);
					strncpy(tmpDrives[currentDrive].device, ent->mnt_fsname, 255-1);
					statDrives[currentDrive] = mount_stat.st_ino;
					drive_found = currentDrive;
					currentDrive++;
				}
				if (strcmp(ent->mnt_dir, "/") == 0) {
					strcpy(tmpDrives[drive_found].label, "root");
					LOG_DEBUG("drive %s set to preferred\n", ent->mnt_fsname);
					tmpDrives[drive_found].preferred = true;
				}
			}
		}
	}
	endmntent(aFile);

	if (diskInfos == NULL) {
		*disk_info_size = currentDrive;
		free(tmpDrives);
		result = FUNC_RET_OK;
	} else if (*disk_info_size >= currentDrive) {
		disk_by_uuid_dir = opendir("/dev/disk/by-uuid");
		if (disk_by_uuid_dir == NULL) {
			LOG_WARN("Open /dev/disk/by-uuid fail");
			free(statDrives);
			return FUNC_RET_ERROR;
		}
		result = FUNC_RET_OK;
		*disk_info_size = currentDrive;
		while ((dir = readdir(disk_by_uuid_dir)) != NULL) {
			strcpy(cur_dir, "/dev/disk/by-uuid/");
			strncat(cur_dir, dir->d_name, 200);
			if (stat(cur_dir, &sym_stat) == 0) {
				for (i = 0; i < currentDrive; i++) {
					if (sym_stat.st_ino == statDrives[i]) {
						parseUUID(dir->d_name, tmpDrives[i].disk_sn,
								sizeof(tmpDrives[i].disk_sn));
#ifdef _DEBUG
						VALGRIND_CHECK_VALUE_IS_DEFINED(tmpDrives[i].device);

						LOG_DEBUG("uuid %d %s %02x%02x%02x%02x\n", i,
								tmpDrives[i].device,
								tmpDrives[i].disk_sn[0],
								tmpDrives[i].disk_sn[1],
								tmpDrives[i].disk_sn[2],
								tmpDrives[i].disk_sn[3]);
#endif
					}
				}
			}
		}
		closedir(disk_by_uuid_dir);

		disk_by_label = opendir("/dev/disk/by-label");
		if (disk_by_label != NULL) {
			while ((dir = readdir(disk_by_label)) != NULL) {
				strcpy(cur_dir, "/dev/disk/by-label/");
				strcat(cur_dir, dir->d_name);
				if (stat(cur_dir, &sym_stat) == 0) {
					for (i = 0; i < currentDrive; i++) {
						if (sym_stat.st_ino == statDrives[i]) {
							strncpy(tmpDrives[i].label, dir->d_name, 255-1);
							printf("label %d %s %s\n", i, tmpDrives[i].label,
									tmpDrives[i].device);
						}
					}
				}
			}
			closedir(disk_by_label);
		}
	} else {
		result = FUNC_RET_BUFFER_TOO_SMALL;
	}
	/*
	 FILE *mounts = fopen(_PATH_MOUNTED, "r");
	 if (mounts == NULL) {
	 return ERROR;
	 }

	 while (fscanf(mounts, "%64s %64s %64s %1024[^\n]", device, name, type,
	 discard) != EOF) {
	 if (stat(device, &mount_stat) != 0)
	 continue;
	 if (filename_stat.st_dev == mount_stat.st_rdev) {
	 fprintf(stderr, "device: %s; name: %s; type: %s\n", device, name,
	 type);
	 }
	 }
	 */
	free(statDrives);
	return result;
}